

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2d.cpp
# Opt level: O3

void __thiscall Texture2D::init_texture(Texture2D *this)

{
  (*glad_glGenTextures)(1,&this->m_id);
  (*glad_glBindTexture)(0xde1,this->m_id);
  return;
}

Assistant:

void Texture2D::init_texture()
{
#if OPENGL_VERSION >= 45
    glCreateTextures(GL_TEXTURE_2D, 1, &m_id);
#else
    glGenTextures(1, &m_id);
    bind();
#endif
}